

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer-a2.cpp
# Opt level: O1

void __thiscall RasterizerA2::_renderImpl<CompositorSIMD,false>(RasterizerA2 *this,uint32_t argb32)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  int32_t *piVar3;
  uint uVar4;
  Image *pIVar5;
  long lVar6;
  Bounds *pBVar7;
  size_t sVar8;
  Cell *pCVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ulong uVar23;
  int iVar24;
  uint8_t *puVar25;
  long lVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  short sVar33;
  short sVar35;
  short sVar36;
  short sVar37;
  short sVar38;
  short sVar39;
  short sVar40;
  undefined1 auVar34 [16];
  short sVar41;
  undefined1 in_XMM1 [16];
  undefined1 auVar42 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar48 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar49 [16];
  short sVar50;
  short sVar57;
  ushort uVar58;
  ushort uVar60;
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 in_XMM13 [16];
  int iVar63;
  int iVar67;
  int iVar68;
  int iVar69;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  short sVar43;
  short sVar46;
  undefined1 auVar51 [12];
  undefined1 auVar53 [16];
  short sVar59;
  
  auVar22 = _DAT_00112190;
  auVar21 = _DAT_00112160;
  uVar28 = (this->_yBounds).start;
  uVar23 = (ulong)(int)uVar28;
  uVar4 = (this->_yBounds).end;
  if (uVar28 <= uVar4) {
    pIVar5 = (this->super_CellRasterizer).super_Rasterizer._dst;
    lVar6 = pIVar5->_stride;
    iVar27 = (argb32 & 0xff00ff) * (argb32 >> 0x18);
    iVar24 = (argb32 >> 8 & 0xff | 0xff0000) * (argb32 >> 0x18);
    uVar28 = iVar27 + (iVar27 + 0x800080U >> 8 & 0xff00ff) + 0x800080 >> 8 & 0xff00ff |
             (iVar24 + 0x800080U >> 8 & 0xff00ff) + iVar24 + 0x800080 & 0xff00ff00;
    auVar34._4_4_ = uVar28;
    auVar34._0_4_ = uVar28;
    auVar34._8_4_ = uVar28;
    auVar34._12_4_ = uVar28;
    auVar34 = pmovzxbw(auVar34,auVar34);
    puVar25 = pIVar5->_data + lVar6 * uVar23;
    lVar26 = uVar23 * 8;
    auVar42 = pmovsxwd(in_XMM1,0x1ff01ff01ff01ff);
    auVar47 = pmovzxbw(in_XMM3,0x8080808080808080);
    auVar48 = pmovzxbw(in_XMM7,0xffffffffffffffff);
    auVar49 = pmovzxbw(in_XMM8,0x8080808080808080);
    do {
      pBVar7 = this->_xBounds;
      if (pBVar7[uVar23].end != 0) {
        sVar8 = this->_cellStride;
        pCVar9 = this->_cells;
        iVar27 = pBVar7[uVar23].end + 1;
        iVar24 = (this->super_CellRasterizer).super_Rasterizer._width;
        if (iVar24 < iVar27) {
          iVar27 = iVar24;
        }
        uVar29 = (ulong)pBVar7[uVar23].start;
        pBVar7[uVar23].start = 0x7fffffff;
        pBVar7[uVar23].end = 0;
        uVar30 = (ulong)iVar27;
        iVar24 = 0;
        sVar33 = auVar34._0_2_;
        sVar35 = auVar34._2_2_;
        sVar36 = auVar34._4_2_;
        sVar37 = auVar34._6_2_;
        sVar38 = auVar34._8_2_;
        sVar39 = auVar34._10_2_;
        sVar40 = auVar34._12_2_;
        sVar41 = auVar34._14_2_;
        if (3 < uVar30 - uVar29) {
          uVar31 = uVar30 - uVar29 >> 2;
          lVar32 = sVar8 * lVar26;
          do {
            piVar1 = (int32_t *)((long)&pCVar9[uVar29].cover + lVar32);
            iVar27 = *piVar1;
            piVar3 = (int32_t *)((long)&pCVar9[uVar29 + 2].cover + lVar32);
            iVar67 = iVar27 + piVar1[2];
            auVar55._4_4_ = iVar67;
            auVar55._0_4_ = iVar27;
            auVar55._8_8_ = 0;
            iVar63 = iVar27 + iVar24;
            iVar68 = iVar67 + iVar24;
            iVar69 = piVar1[2] + *piVar3 + iVar24;
            iVar24 = *piVar3 + piVar3[2] + iVar24 + iVar67;
            auVar64._0_4_ = iVar63 - ((uint)piVar1[1] >> 9);
            auVar64._4_4_ = iVar68 - ((uint)piVar1[3] >> 9);
            auVar64._8_4_ = (iVar69 + iVar27) - ((uint)piVar3[1] >> 9);
            auVar64._12_4_ = iVar24 - ((uint)piVar3[3] >> 9);
            auVar65 = packusdw(auVar64 & auVar42,auVar64 & auVar42);
            iVar27 = 0x1ff01ff - auVar65._0_4_;
            iVar63 = 0x1ff01ff - auVar65._4_4_;
            iVar67 = 0x1ff01ff - auVar65._8_4_;
            iVar68 = 0x1ff01ff - auVar65._12_4_;
            sVar20 = auVar65._0_2_;
            sVar50 = (short)iVar27;
            sVar43 = auVar65._2_2_;
            sVar57 = (short)((uint)iVar27 >> 0x10);
            sVar46 = auVar65._4_2_;
            sVar59 = (short)iVar63;
            uVar58 = (ushort)(sVar46 < sVar59) * sVar46 | (ushort)(sVar46 >= sVar59) * sVar59;
            sVar46 = auVar65._6_2_;
            sVar59 = (short)((uint)iVar63 >> 0x10);
            uVar60 = (ushort)(sVar46 < sVar59) * sVar46 | (ushort)(sVar46 >= sVar59) * sVar59;
            auVar52._0_8_ =
                 CONCAT26(uVar60,CONCAT24(uVar58,CONCAT22((ushort)(sVar43 < sVar57) * sVar43 |
                                                          (ushort)(sVar43 >= sVar57) * sVar57,
                                                          (ushort)(sVar20 < sVar50) * sVar20 |
                                                          (ushort)(sVar20 >= sVar50) * sVar50)));
            sVar20 = auVar65._8_2_;
            sVar43 = (short)iVar67;
            auVar51._0_10_ =
                 CONCAT28((ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43,
                          auVar52._0_8_);
            sVar20 = auVar65._10_2_;
            sVar43 = (short)((uint)iVar67 >> 0x10);
            auVar51._10_2_ =
                 (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43;
            sVar20 = auVar65._12_2_;
            sVar43 = (short)iVar68;
            sVar46 = (short)((uint)iVar68 >> 0x10);
            auVar61._12_2_ =
                 (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43;
            auVar61._0_12_ = auVar51;
            sVar20 = auVar65._14_2_;
            auVar61._14_2_ =
                 (ushort)(sVar20 < sVar46) * sVar20 | (ushort)(sVar20 >= sVar46) * sVar46;
            auVar61 = pshuflw(auVar55 << 0x40,auVar61,0x50);
            auVar66._12_2_ = uVar60;
            auVar66._0_12_ = auVar51;
            auVar66._14_2_ = uVar60;
            auVar53._12_4_ = auVar66._12_4_;
            auVar53._10_2_ = uVar58;
            auVar53._0_10_ = auVar51._0_10_;
            auVar52._10_6_ = auVar53._10_6_;
            auVar52._8_2_ = uVar58;
            *(undefined1 (*) [16])((long)&pCVar9[uVar29].cover + lVar32) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)&pCVar9[uVar29 + 2].cover + lVar32) = (undefined1  [16])0x0
            ;
            auVar55 = *(undefined1 (*) [16])(puVar25 + uVar29 * 4);
            auVar66 = pmovzxbw(auVar65,auVar55);
            in_XMM13._0_2_ = CONCAT11(0,auVar55[8]);
            in_XMM13[2] = auVar55[9];
            in_XMM13[3] = 0;
            in_XMM13[4] = auVar55[10];
            in_XMM13[5] = 0;
            in_XMM13[6] = auVar55[0xb];
            in_XMM13[7] = 0;
            in_XMM13[8] = auVar55[0xc];
            in_XMM13[9] = 0;
            in_XMM13[10] = auVar55[0xd];
            in_XMM13[0xb] = 0;
            in_XMM13[0xc] = auVar55[0xe];
            in_XMM13[0xd] = 0;
            in_XMM13[0xe] = auVar55[0xf];
            in_XMM13[0xf] = 0;
            auVar62._0_4_ = auVar61._0_4_;
            auVar62._4_4_ = auVar62._0_4_;
            auVar62._8_4_ = auVar61._4_4_;
            auVar62._12_4_ = auVar61._4_4_;
            auVar65._4_4_ = auVar52._8_4_;
            auVar65._0_4_ = auVar52._8_4_;
            auVar65._8_4_ = auVar53._12_4_;
            auVar65._12_4_ = auVar53._12_4_;
            auVar62 = auVar62 ^ auVar48;
            auVar65 = auVar65 ^ auVar48;
            auVar70._0_2_ = auVar61._0_2_ * sVar33 + auVar49._0_2_ + auVar62._0_2_ * auVar66._0_2_;
            auVar70._2_2_ = auVar61._2_2_ * sVar35 + auVar49._2_2_ + auVar62._2_2_ * auVar66._2_2_;
            auVar70._4_2_ = auVar61._0_2_ * sVar36 + auVar49._4_2_ + auVar62._4_2_ * auVar66._4_2_;
            auVar70._6_2_ = auVar61._2_2_ * sVar37 + auVar49._6_2_ + auVar62._6_2_ * auVar66._6_2_;
            auVar70._8_2_ = auVar61._4_2_ * sVar38 + auVar49._8_2_ + auVar62._8_2_ * auVar66._8_2_;
            auVar70._10_2_ =
                 auVar61._6_2_ * sVar39 + auVar49._10_2_ + auVar62._10_2_ * auVar66._10_2_;
            auVar70._12_2_ =
                 auVar61._4_2_ * sVar40 + auVar49._12_2_ + auVar62._12_2_ * auVar66._12_2_;
            auVar70._14_2_ =
                 auVar61._6_2_ * sVar41 + auVar49._14_2_ + auVar62._14_2_ * auVar66._14_2_;
            auVar61 = pmulhuw(auVar70,auVar21);
            auVar54._0_2_ = uVar58 * sVar33 + auVar49._0_2_ + auVar65._0_2_ * in_XMM13._0_2_;
            auVar54._2_2_ = uVar58 * sVar35 + auVar49._2_2_ + auVar65._2_2_ * (ushort)auVar55[9];
            auVar54._4_2_ = uVar58 * sVar36 + auVar49._4_2_ + auVar65._4_2_ * (ushort)auVar55[10];
            auVar54._6_2_ = uVar58 * sVar37 + auVar49._6_2_ + auVar65._6_2_ * (ushort)auVar55[0xb];
            auVar54._8_2_ = uVar60 * sVar38 + auVar49._8_2_ + auVar65._8_2_ * (ushort)auVar55[0xc];
            auVar54._10_2_ =
                 uVar60 * sVar39 + auVar49._10_2_ + auVar65._10_2_ * (ushort)auVar55[0xd];
            auVar54._12_2_ =
                 uVar60 * sVar40 + auVar49._12_2_ + auVar65._12_2_ * (ushort)auVar55[0xe];
            auVar54._14_2_ =
                 uVar60 * sVar41 + auVar49._14_2_ + auVar65._14_2_ * (ushort)auVar55[0xf];
            auVar55 = pmulhuw(auVar54,auVar21);
            sVar20 = auVar61._0_2_;
            sVar43 = auVar61._2_2_;
            sVar46 = auVar61._4_2_;
            sVar50 = auVar61._6_2_;
            sVar57 = auVar61._8_2_;
            sVar59 = auVar61._10_2_;
            sVar10 = auVar61._12_2_;
            sVar11 = auVar61._14_2_;
            sVar12 = auVar55._0_2_;
            sVar13 = auVar55._2_2_;
            sVar14 = auVar55._4_2_;
            sVar15 = auVar55._6_2_;
            sVar16 = auVar55._8_2_;
            sVar17 = auVar55._10_2_;
            sVar18 = auVar55._12_2_;
            sVar19 = auVar55._14_2_;
            puVar2 = puVar25 + uVar29 * 4;
            *puVar2 = (0 < sVar20) * (sVar20 < 0x100) * auVar61[0] - (0xff < sVar20);
            puVar2[1] = (0 < sVar43) * (sVar43 < 0x100) * auVar61[2] - (0xff < sVar43);
            puVar2[2] = (0 < sVar46) * (sVar46 < 0x100) * auVar61[4] - (0xff < sVar46);
            puVar2[3] = (0 < sVar50) * (sVar50 < 0x100) * auVar61[6] - (0xff < sVar50);
            puVar2[4] = (0 < sVar57) * (sVar57 < 0x100) * auVar61[8] - (0xff < sVar57);
            puVar2[5] = (0 < sVar59) * (sVar59 < 0x100) * auVar61[10] - (0xff < sVar59);
            puVar2[6] = (0 < sVar10) * (sVar10 < 0x100) * auVar61[0xc] - (0xff < sVar10);
            puVar2[7] = (0 < sVar11) * (sVar11 < 0x100) * auVar61[0xe] - (0xff < sVar11);
            puVar2[8] = (0 < sVar12) * (sVar12 < 0x100) * auVar55[0] - (0xff < sVar12);
            puVar2[9] = (0 < sVar13) * (sVar13 < 0x100) * auVar55[2] - (0xff < sVar13);
            puVar2[10] = (0 < sVar14) * (sVar14 < 0x100) * auVar55[4] - (0xff < sVar14);
            puVar2[0xb] = (0 < sVar15) * (sVar15 < 0x100) * auVar55[6] - (0xff < sVar15);
            puVar2[0xc] = (0 < sVar16) * (sVar16 < 0x100) * auVar55[8] - (0xff < sVar16);
            puVar2[0xd] = (0 < sVar17) * (sVar17 < 0x100) * auVar55[10] - (0xff < sVar17);
            puVar2[0xe] = (0 < sVar18) * (sVar18 < 0x100) * auVar55[0xc] - (0xff < sVar18);
            puVar2[0xf] = (0 < sVar19) * (sVar19 < 0x100) * auVar55[0xe] - (0xff < sVar19);
            uVar29 = uVar29 + 4;
            uVar31 = uVar31 - 1;
          } while (uVar31 != 0);
        }
        in_XMM13 = pmovzxbw(in_XMM13,0xffffffffffffffff);
        if (uVar29 < uVar30) {
          lVar32 = sVar8 * lVar26;
          iVar27 = iVar24;
          do {
            iVar27 = iVar27 + *(int32_t *)((long)&pCVar9[uVar29].cover + lVar32);
            *(undefined8 *)((long)&pCVar9[uVar29].cover + lVar32) = 0;
            auVar56._0_4_ = iVar27 - ((uint)*(int32_t *)((long)&pCVar9[uVar29].area + lVar32) >> 9);
            auVar56._4_4_ = iVar24;
            auVar56._8_4_ = iVar24;
            auVar56._12_4_ = iVar24;
            auVar55 = packusdw(auVar56 & auVar42,auVar56 & auVar42);
            iVar63 = auVar42._0_4_ - auVar55._0_4_;
            iVar67 = auVar42._4_4_ - auVar55._4_4_;
            iVar68 = auVar42._8_4_ - auVar55._8_4_;
            iVar69 = auVar42._12_4_ - auVar55._12_4_;
            sVar20 = auVar55._0_2_;
            sVar43 = (short)iVar63;
            auVar44._0_2_ = (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43
            ;
            sVar20 = auVar55._2_2_;
            sVar43 = (short)((uint)iVar63 >> 0x10);
            auVar44._2_2_ = (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43
            ;
            sVar20 = auVar55._4_2_;
            sVar43 = (short)iVar67;
            auVar44._4_2_ = (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43
            ;
            sVar20 = auVar55._6_2_;
            sVar43 = (short)((uint)iVar67 >> 0x10);
            auVar44._6_2_ = (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43
            ;
            sVar20 = auVar55._8_2_;
            sVar43 = (short)iVar68;
            auVar44._8_2_ = (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43
            ;
            sVar20 = auVar55._10_2_;
            sVar43 = (short)((uint)iVar68 >> 0x10);
            auVar44._10_2_ =
                 (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43;
            sVar20 = auVar55._12_2_;
            sVar43 = (short)iVar69;
            sVar46 = (short)((uint)iVar69 >> 0x10);
            auVar44._12_2_ =
                 (ushort)(sVar20 < sVar43) * sVar20 | (ushort)(sVar20 >= sVar43) * sVar43;
            sVar20 = auVar55._14_2_;
            auVar44._14_2_ =
                 (ushort)(sVar20 < sVar46) * sVar20 | (ushort)(sVar20 >= sVar46) * sVar46;
            auVar55 = pshuflw(auVar44,auVar44,0);
            auVar61 = pmovzxbw(ZEXT416(*(uint *)(puVar25 + uVar29 * 4)),
                               ZEXT416(*(uint *)(puVar25 + uVar29 * 4)));
            auVar65 = auVar55 ^ in_XMM13;
            auVar45._0_2_ = auVar65._0_2_ * auVar61._0_2_ + auVar55._0_2_ * sVar33 + auVar47._0_2_;
            auVar45._2_2_ = auVar65._2_2_ * auVar61._2_2_ + auVar55._2_2_ * sVar35 + auVar47._2_2_;
            auVar45._4_2_ = auVar65._4_2_ * auVar61._4_2_ + auVar55._4_2_ * sVar36 + auVar47._4_2_;
            auVar45._6_2_ = auVar65._6_2_ * auVar61._6_2_ + auVar55._6_2_ * sVar37 + auVar47._6_2_;
            auVar45._8_2_ = auVar65._8_2_ * auVar61._8_2_ + auVar55._8_2_ * sVar38 + auVar47._8_2_;
            auVar45._10_2_ =
                 auVar65._10_2_ * auVar61._10_2_ + auVar55._10_2_ * sVar39 + auVar47._10_2_;
            auVar45._12_2_ =
                 auVar65._12_2_ * auVar61._12_2_ + auVar55._12_2_ * sVar40 + auVar47._12_2_;
            auVar45._14_2_ =
                 auVar65._14_2_ * auVar61._14_2_ + auVar55._14_2_ * sVar41 + auVar47._14_2_;
            auVar55 = pmulhuw(auVar45,auVar22);
            sVar20 = auVar55._0_2_;
            sVar43 = auVar55._2_2_;
            sVar46 = auVar55._4_2_;
            sVar50 = auVar55._6_2_;
            *(uint *)(puVar25 + uVar29 * 4) =
                 CONCAT13((0 < sVar50) * (sVar50 < 0x100) * auVar55[6] - (0xff < sVar50),
                          CONCAT12((0 < sVar46) * (sVar46 < 0x100) * auVar55[4] - (0xff < sVar46),
                                   CONCAT11((0 < sVar43) * (sVar43 < 0x100) * auVar55[2] -
                                            (0xff < sVar43),
                                            (0 < sVar20) * (sVar20 < 0x100) * auVar55[0] -
                                            (0xff < sVar20))));
            uVar29 = uVar29 + 1;
          } while (uVar30 != uVar29);
        }
      }
      uVar23 = uVar23 + 1;
      puVar25 = puVar25 + lVar6;
      lVar26 = lVar26 + 8;
    } while (uVar23 <= (ulong)(long)(int)uVar4);
  }
  (this->_yBounds).start = 0x7fffffff;
  (this->_yBounds).end = 0;
  return;
}

Assistant:

inline void RasterizerA2::_renderImpl(uint32_t argb32) noexcept {
  size_t y0 = size_t(_yBounds.start);
  size_t y1 = size_t(_yBounds.end);

  intptr_t stride = _dst->stride();
  uint8_t* dstLine = _dst->data() + y0 * stride;

  Compositor compositor(argb32);
  while (y0 <= y1) {
    uint32_t* dstPix = reinterpret_cast<uint32_t*>(dstLine);
    Cell* cell = &_cells[y0 * _cellStride];

    if (!_xBounds[y0].empty()) {
      int x0 = _xBounds[y0].start;
      int x1 = std::min(_xBounds[y0].end + 1, _width);
      _xBounds[y0].reset();

      int cover = 0;
      compositor.template vmask<NonZero>(dstPix, size_t(x0), size_t(x1), cell, cover);
    }

    y0++;
    dstLine += stride;
  }

  _yBounds.reset();
}